

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  long lVar1;
  pointer pvVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  cmsysProcess *cp;
  long *plVar7;
  pointer pcVar8;
  char *pcVar9;
  ostream *poVar10;
  ulong *puVar11;
  bool bVar12;
  cmMakefile *pcVar13;
  pointer pbVar14;
  vector<char,std::allocator<char>> *pvVar15;
  Encoding EVar16;
  long lVar17;
  int idx;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd;
  vector<char_const*,std::allocator<char_const*>> *pvVar18;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd_1;
  ulong uVar19;
  size_t sVar20;
  cmProcessOutput processOutput;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char buf [16];
  string error_variable;
  string output_variable;
  string output_file;
  char *data;
  double timeout;
  string results_variable;
  string result_variable;
  string strdata;
  string error_file;
  string working_directory;
  string input_file;
  string timeout_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string arguments;
  cmProcessOutput local_449;
  cmCommand *local_448;
  Encoding local_43c;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_438;
  ulong local_418;
  int local_40c;
  vector<char,_std::allocator<char>_> local_408;
  vector<char,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined8 local_3a0;
  ulong local_398;
  uint local_38c;
  string local_388;
  string local_368;
  string local_348;
  vector<char,_std::allocator<char>_> local_328;
  vector<char,_std::allocator<char>_> local_308;
  char *local_2f0;
  double local_2e8;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [112];
  ios_base local_230 [264];
  char *local_128;
  size_t local_120;
  char local_118;
  undefined7 uStack_117;
  char *local_108;
  long local_100;
  char local_f8;
  undefined7 uStack_f7;
  char *local_e8;
  long local_e0;
  char local_d8;
  undefined7 uStack_d7;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_448 = &this->super_cmCommand;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_2a0._0_8_ = local_2a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a0,"called with incorrect number of arguments","");
    cmCommand::SetError(local_448,(string *)local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    return false;
  }
  local_438.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar12 = false;
  local_438.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_e8 = &local_d8;
  local_e0 = 0;
  local_d8 = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = '\0';
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_418 = 0;
  local_398 = 0;
  uVar6 = 0;
  EVar16 = None;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
    bVar3 = false;
    lVar17 = 0;
    local_398 = 0;
    local_418 = 0;
    local_3a0 = 0;
    uVar19 = 0;
    local_43c = None;
    bVar12 = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar14 + uVar19));
      if (iVar4 == 0) {
        lVar17 = ((long)local_438.
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_438.
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          bVar3 = true;
          std::
          vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ::_M_realloc_insert<>
                    (&local_438,
                     (iterator)
                     local_438.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          ((local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_438.
          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_438.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          bVar3 = true;
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar19));
        if (iVar4 == 0) {
          uVar19 = uVar19 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
            local_2a0._0_8_ = local_2a0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a0," called with no value for OUTPUT_VARIABLE.","");
            cmCommand::SetError(local_448,(string *)local_2a0);
            goto LAB_001f4a54;
          }
          std::__cxx11::string::_M_assign((string *)&local_368);
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar19));
          if (iVar4 == 0) {
            uVar19 = uVar19 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
              local_2a0._0_8_ = local_2a0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2a0," called with no value for ERROR_VARIABLE.","");
              cmCommand::SetError(local_448,(string *)local_2a0);
              goto LAB_001f4a54;
            }
            std::__cxx11::string::_M_assign((string *)&local_388);
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar19));
            if (iVar4 == 0) {
              uVar19 = uVar19 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
                local_2a0._0_8_ = local_2a0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2a0," called with no value for RESULT_VARIABLE.","");
                cmCommand::SetError(local_448,(string *)local_2a0);
                goto LAB_001f4a54;
              }
              std::__cxx11::string::_M_assign((string *)&local_2c0);
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar19));
              if (iVar4 == 0) {
                uVar19 = uVar19 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
                  local_2a0._0_8_ = local_2a0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2a0," called with no value for RESULTS_VARIABLE.","");
                  cmCommand::SetError(local_448,(string *)local_2a0);
                  goto LAB_001f4a54;
                }
                std::__cxx11::string::_M_assign((string *)&local_2e0);
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar19));
                if (iVar4 == 0) {
                  uVar19 = uVar19 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
                    local_2a0._0_8_ = local_2a0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2a0," called with no value for WORKING_DIRECTORY.",""
                              );
                    cmCommand::SetError(local_448,(string *)local_2a0);
                    goto LAB_001f4a54;
                  }
                  std::__cxx11::string::_M_assign((string *)&local_108);
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar19));
                  if (iVar4 == 0) {
                    uVar19 = uVar19 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19) {
                      local_2a0._0_8_ = local_2a0 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2a0," called with no value for INPUT_FILE.","");
                      cmCommand::SetError(local_448,(string *)local_2a0);
                      goto LAB_001f4a54;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_e8);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar19)
                                      );
                    if (iVar4 == 0) {
                      uVar19 = uVar19 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19)
                      {
                        local_2a0._0_8_ = local_2a0 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2a0," called with no value for OUTPUT_FILE.","");
                        cmCommand::SetError(local_448,(string *)local_2a0);
                        goto LAB_001f4a54;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_348);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar19));
                      if (iVar4 == 0) {
                        uVar19 = uVar19 + 1;
                        if ((ulong)((long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar19
                           ) {
                          local_2a0._0_8_ = local_2a0 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2a0," called with no value for ERROR_FILE.","")
                          ;
                          cmCommand::SetError(local_448,(string *)local_2a0);
                          goto LAB_001f4a54;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_128);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                        if (iVar4 == 0) {
                          uVar19 = uVar19 + 1;
                          if ((ulong)((long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 5) <=
                              uVar19) {
                            local_2a0._0_8_ = local_2a0 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2a0," called with no value for TIMEOUT.","");
                            cmCommand::SetError(local_448,(string *)local_2a0);
                            goto LAB_001f4a54;
                          }
                          std::__cxx11::string::_M_assign((string *)&local_c8);
                        }
                        else {
                          uVar6 = std::__cxx11::string::compare
                                            ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                          if ((int)uVar6 == 0) {
                            local_398 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                          }
                          else {
                            uVar6 = std::__cxx11::string::compare
                                              ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                            if ((int)uVar6 == 0) {
                              local_418 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                            }
                            else {
                              uVar6 = std::__cxx11::string::compare
                                                ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                              if ((int)uVar6 == 0) {
                                local_3a0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare
                                                  ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                                if (iVar4 == 0) {
                                  bVar12 = true;
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare
                                                    ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar19));
                                  if (iVar4 != 0) {
                                    if (bVar3) {
                                      local_2a0._0_8_ =
                                           (args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar19].
                                           _M_dataplus._M_p;
                                      std::vector<char_const*,std::allocator<char_const*>>::
                                      emplace_back<char_const*>
                                                ((vector<char_const*,std::allocator<char_const*>> *)
                                                 ((long)local_438.
                                                                                                                
                                                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar17 * 0x18),(char **)local_2a0);
                                      goto LAB_001f478b;
                                    }
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_2a0);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_2a0," given unknown argument \"",
                                               0x19);
                                    pbVar14 = (args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start;
                                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)local_2a0,
                                                         pbVar14[uVar19]._M_dataplus._M_p,
                                                         pbVar14[uVar19]._M_string_length);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,"\".",2);
                                    std::__cxx11::stringbuf::str();
                                    cmCommand::SetError(local_448,&local_3c8);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                                      operator_delete(local_3c8._M_dataplus._M_p,
                                                      local_3c8.field_2._M_allocated_capacity + 1);
                                    }
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_2a0);
                                    std::ios_base::~ios_base(local_230);
                                    goto LAB_001f4a71;
                                  }
                                  uVar19 = uVar19 + 1;
                                  pbVar14 = (args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start;
                                  if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pbVar14 >> 5) <= uVar19) {
                                    local_2a0._0_8_ = local_2a0 + 0x10;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_2a0,
                                               " called with no value for ENCODING.","");
                                    cmCommand::SetError(local_448,(string *)local_2a0);
                                    goto LAB_001f4a54;
                                  }
                                  local_43c = cmProcessOutput::FindEncoding(pbVar14 + uVar19);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar3 = false;
      }
LAB_001f478b:
      uVar19 = uVar19 + 1;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = local_3a0;
      EVar16 = local_43c;
    } while (uVar19 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
  }
  bVar3 = cmMakefile::CanIWriteThisFile(local_448->Makefile,&local_348);
  pvVar2 = local_438.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar3) {
    std::operator+(&local_3c8,"attempted to output into a file: ",&local_348);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c8);
    local_2a0._0_8_ = local_2a0 + 0x10;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_2a0._16_8_ = *puVar11;
      local_2a0._24_8_ = plVar7[3];
    }
    else {
      local_2a0._16_8_ = *puVar11;
      local_2a0._0_8_ = (ulong *)*plVar7;
    }
    local_2a0._8_8_ = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(local_448,(string *)local_2a0);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_001f4a54:
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
LAB_001f4a61:
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
LAB_001f4a71:
    bVar12 = false;
    goto LAB_001f4a73;
  }
  if (local_438.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_438.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2a0._0_8_ = local_2a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a0," called with no COMMAND argument.","");
    cmCommand::SetError(local_448,(string *)local_2a0);
    goto LAB_001f4a54;
  }
  pvVar18 = (vector<char_const*,std::allocator<char_const*>> *)
            local_438.
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_43c = EVar16;
  local_3a0 = uVar6;
  do {
    lVar17 = *(long *)pvVar18;
    lVar1 = *(long *)(pvVar18 + 8);
    if (lVar17 == lVar1) {
      local_2a0._0_8_ = local_2a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a0," given COMMAND argument with no value.","");
      cmCommand::SetError(local_448,(string *)local_2a0);
      if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
    }
    else {
      local_2a0._0_8_ = (ulong *)0x0;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                (pvVar18,(char **)local_2a0);
    }
    if (lVar17 == lVar1) goto LAB_001f4a71;
    pvVar18 = pvVar18 + 0x18;
  } while (pvVar18 != (vector<char_const*,std::allocator<char_const*>> *)pvVar2);
  local_2e8 = -1.0;
  if ((local_c0 != 0) && (iVar4 = __isoc99_sscanf(local_c8,"%lg",&local_2e8), iVar4 != 1)) {
    local_2a0._0_8_ = local_2a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a0," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(local_448,(string *)local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) goto LAB_001f4a61;
    goto LAB_001f4a71;
  }
  cp = cmsysProcess_New();
  pvVar2 = local_438.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar18 = (vector<char_const*,std::allocator<char_const*>> *)
                 local_438.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar18 != (vector<char_const*,std::allocator<char_const*>> *)pvVar2; pvVar18 = pvVar18 + 0x18
      ) {
    cmsysProcess_AddCommand(cp,*(char ***)pvVar18);
  }
  if (local_100 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_108);
  }
  cmsysProcess_SetOption(cp,0,1);
  EVar16 = local_43c;
  if (local_e0 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_e8);
  }
  if (local_348._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_348._M_dataplus._M_p);
  }
  if (local_120 == 0) {
LAB_001f4cf8:
    uVar5 = 0;
  }
  else {
    if ((local_120 != local_348._M_string_length) ||
       (iVar4 = bcmp(local_128,local_348._M_dataplus._M_p,local_120), iVar4 != 0)) {
      cmsysProcess_SetPipeFile(cp,3,local_128);
      goto LAB_001f4cf8;
    }
    uVar5 = (uint)CONCAT71((int7)((ulong)pvVar18 >> 8),1);
  }
  local_38c = uVar5;
  if ((local_368._M_string_length != 0) &&
     (local_368._M_string_length == local_388._M_string_length)) {
    iVar4 = bcmp(local_368._M_dataplus._M_p,local_388._M_dataplus._M_p,local_368._M_string_length);
    local_38c = 1;
    if (iVar4 != 0) {
      local_38c = uVar5 & 0xff;
    }
  }
  if ((char)local_38c != '\0') {
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_2e8) {
    cmsysProcess_SetTimeout(cp,local_2e8);
  }
  cmsysProcess_Execute(cp);
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  cmProcessOutput::cmProcessOutput(&local_449,EVar16,0x400);
  local_2a0._0_8_ = local_2a0 + 0x10;
  local_2a0._8_8_ = 0;
  local_2a0._16_8_ = local_2a0._16_8_ & 0xffffffffffffff00;
LAB_001f4ddb:
  do {
    while (iVar4 = cmsysProcess_WaitForData(cp,&local_2f0,&local_40c,(double *)0x0), iVar4 == 2) {
      if ((local_398 & 1) == 0) {
        if (local_368._M_string_length == 0) {
          cmProcessOutput::DecodeText(&local_449,local_2f0,(long)local_40c,(string *)local_2a0,1);
          cmSystemTools::Stdout((string *)local_2a0);
        }
        else {
          pcVar8 = local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pvVar15 = (vector<char,std::allocator<char>> *)&local_3e8;
LAB_001f4e69:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>(pvVar15,pcVar8);
        }
      }
    }
    if (iVar4 == 3) {
      if ((local_418 & 1) == 0) {
        pcVar8 = local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pvVar15 = (vector<char,std::allocator<char>> *)&local_408;
        if (local_388._M_string_length != 0) goto LAB_001f4e69;
        cmProcessOutput::DecodeText(&local_449,local_2f0,(long)local_40c,(string *)local_2a0,2);
        cmSystemTools::Stderr((string *)local_2a0);
      }
      goto LAB_001f4ddb;
    }
  } while (iVar4 != 0);
  if ((local_398 & 1) == 0 && local_368._M_string_length == 0) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_449,&local_50,(string *)local_2a0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_2a0._8_8_ != 0) {
      cmSystemTools::Stdout((string *)local_2a0);
    }
  }
  if ((local_418 & 1) == 0 && local_388._M_string_length == 0) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    cmProcessOutput::DecodeText(&local_449,&local_70,(string *)local_2a0,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_2a0._8_8_ != 0) {
      cmSystemTools::Stderr((string *)local_2a0);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar19 = (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar19 == 0) {
    pcVar8 = (pointer)0x0;
  }
  else {
    if ((long)uVar19 < 0) goto LAB_001f5815;
    pcVar8 = (pointer)operator_new(uVar19);
  }
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar8 + uVar19;
  sVar20 = (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar8;
  if (sVar20 != 0) {
    local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar8;
    memmove(pcVar8,local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar20);
  }
  local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar8 + sVar20;
  cmProcessOutput::DecodeText(&local_449,&local_308,&local_3e8,0);
  if (local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar19 = (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar19 == 0) {
    pcVar8 = (pointer)0x0;
  }
  else {
    if ((long)uVar19 < 0) {
LAB_001f5815:
      std::__throw_bad_alloc();
    }
    pcVar8 = (pointer)operator_new(uVar19);
  }
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar8 + uVar19;
  sVar20 = (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar8;
  if (sVar20 != 0) {
    local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar8;
    memmove(pcVar8,local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar20);
  }
  local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar8 + sVar20;
  cmProcessOutput::DecodeText(&local_449,&local_328,&local_408,0);
  uVar6 = local_3a0;
  if (local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cmExecuteProcessCommandFixText(&local_3e8,(bool)((byte)uVar6 & 1));
  cmExecuteProcessCommandFixText(&local_408,bVar12);
  if ((local_368._M_string_length != 0) &&
     (local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_448->Makefile,&local_368,
               local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if ((((char)local_38c == '\0') && (local_388._M_string_length != 0)) &&
     (local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              (local_448->Makefile,&local_388,
               local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_2c0._M_string_length == 0) goto switchD_001f52c4_caseD_3;
  iVar4 = cmsysProcess_GetState(cp);
  switch(iVar4) {
  case 1:
    pcVar13 = local_448->Makefile;
    pcVar9 = cmsysProcess_GetErrorString(cp);
    goto LAB_001f53a7;
  case 2:
    pcVar13 = local_448->Makefile;
    pcVar9 = cmsysProcess_GetExceptionString(cp);
LAB_001f53a7:
    cmMakefile::AddDefinition(pcVar13,&local_2c0,pcVar9);
    break;
  case 4:
    uVar5 = cmsysProcess_GetExitValue(cp);
    sprintf((char *)&local_3c8,"%d",(ulong)uVar5);
    cmMakefile::AddDefinition(local_448->Makefile,&local_2c0,(char *)&local_3c8);
    break;
  case 5:
    cmMakefile::AddDefinition(local_448->Makefile,&local_2c0,"Process terminated due to timeout");
  }
switchD_001f52c4_caseD_3:
  if (local_2e0._M_string_length == 0) goto switchD_001f5409_caseD_3;
  iVar4 = cmsysProcess_GetState(cp);
  switch(iVar4) {
  case 1:
    pcVar13 = local_448->Makefile;
    pcVar9 = cmsysProcess_GetErrorString(cp);
    goto LAB_001f5575;
  case 2:
    pcVar13 = local_448->Makefile;
    pcVar9 = cmsysProcess_GetExceptionString(cp);
LAB_001f5575:
    cmMakefile::AddDefinition(pcVar13,&local_2e0,pcVar9);
    break;
  case 4:
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_438.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_438.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar19 = 0;
      do {
        idx = (int)uVar19;
        iVar4 = cmsysProcess_GetStateByIndex(cp,idx);
        if (iVar4 == 2) {
          local_3c8._M_dataplus._M_p = cmsysProcess_GetExceptionStringByIndex(cp,idx);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char **)&local_3c8);
        }
        else if (iVar4 == 4) {
          uVar5 = cmsysProcess_GetExitValueByIndex(cp,idx);
          sprintf((char *)&local_3c8,"%d",(ulong)uVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char (*) [16])&local_3c8);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[36]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char (*) [36])"Error getting the child return code");
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < (ulong)(((long)local_438.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_438.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    pcVar13 = local_448->Makefile;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_3c8,&local_a8,";");
    cmMakefile::AddDefinition(pcVar13,&local_2e0,local_3c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    break;
  case 5:
    cmMakefile::AddDefinition(local_448->Makefile,&local_2e0,"Process terminated due to timeout");
  }
switchD_001f5409_caseD_3:
  cmsysProcess_Delete(cp);
  if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_449);
  if (local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  bVar12 = true;
LAB_001f4a73:
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                             local_2e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,
                    CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                             local_368.field_2._M_local_buf[0]) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                             local_348.field_2._M_local_buf[0]) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&local_438);
  return bVar12;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::vector<const char*>> cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string results_variable;
  std::string working_directory;
  cmProcessOutput::Encoding encoding = cmProcessOutput::None;
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      doing_command = true;
      command_index = cmds.size();
      cmds.emplace_back();
    } else if (args[i] == "OUTPUT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        output_variable = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "ERROR_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        error_variable = args[i];
      } else {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        result_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULTS_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        results_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULTS_VARIABLE.");
        return false;
      }
    } else if (args[i] == "WORKING_DIRECTORY") {
      doing_command = false;
      if (++i < args.size()) {
        working_directory = args[i];
      } else {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
      }
    } else if (args[i] == "INPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        input_file = args[i];
      } else {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
      }
    } else if (args[i] == "OUTPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        output_file = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
      }
    } else if (args[i] == "ERROR_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        error_file = args[i];
      } else {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
      }
    } else if (args[i] == "TIMEOUT") {
      doing_command = false;
      if (++i < args.size()) {
        timeout_string = args[i];
      } else {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
      }
    } else if (args[i] == "OUTPUT_QUIET") {
      doing_command = false;
      output_quiet = true;
    } else if (args[i] == "ERROR_QUIET") {
      doing_command = false;
      error_quiet = true;
    } else if (args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      output_strip_trailing_whitespace = true;
    } else if (args[i] == "ERROR_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      error_strip_trailing_whitespace = true;
    } else if (args[i] == "ENCODING") {
      doing_command = false;
      if (++i < args.size()) {
        encoding = cmProcessOutput::FindEncoding(args[i]);
      } else {
        this->SetError(" called with no value for ENCODING.");
        return false;
      }
    } else if (doing_command) {
      cmds[command_index].push_back(args[i].c_str());
    } else {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(output_file)) {
    std::string e = "attempted to output into a file: " + output_file +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (cmds.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (auto& cmd : cmds) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
    // Add the null terminating pointer to the command argument list.
    cmd.push_back(nullptr);
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!timeout_string.empty()) {
    if (sscanf(timeout_string.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for (auto const& cmd : cmds) {
    cmsysProcess_AddCommand(cp, cmd.data());
  }

  // Set the process working directory.
  if (!working_directory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!input_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
  }
  if (!output_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
  }
  if (!error_file.empty()) {
    if (error_file == output_file) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
    }
  }
  if (!output_variable.empty() && output_variable == error_variable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet) {
      if (output_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !error_quiet) {
      if (error_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!output_quiet && output_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!error_quiet && error_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput, output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError, error_strip_trailing_whitespace);

  // Store the output obtained.
  if (!output_variable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(output_variable, tempOutput.data());
  }
  if (!merge_output && !error_variable.empty() && !tempError.empty()) {
    this->Makefile->AddDefinition(error_variable, tempError.data());
  }

  // Store the result of running the process.
  if (!result_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!results_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < cmds.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(results_variable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(results_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}